

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::ASTVisitor<hgdb::rtl::Serializer,_true,_false>::
visitDefault<slang::ast::SubroutineSymbol>
          (ASTVisitor<hgdb::rtl::Serializer,_true,_false> *this,SubroutineSymbol *t)

{
  Statement *this_00;
  iterator __begin0;
  iterator local_18;
  
  this_00 = SubroutineSymbol::getBody(t);
  Statement::visit<hgdb::rtl::Serializer&>(this_00,(Serializer *)this);
  if ((t->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&t->super_Scope);
  }
  local_18.current = (t->super_Scope).firstMember;
  while (local_18.current != (Symbol *)0x0) {
    Symbol::visit<hgdb::rtl::Serializer&>(local_18.current,(Serializer *)this);
    Scope::iterator::operator++(&local_18);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && is_detected_v<visitExprs_t, T, TDerived>) {
            t.visitExprs(DERIVED);
        }

        if constexpr (VisitStatements && is_detected_v<visitStmts_t, T, TDerived>) {
            t.visitStmts(DERIVED);
        }

        if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }